

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
InitAttributeData(MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this
                 )

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> att;
  pointer pAVar1;
  pointer pIVar2;
  CornerTable *pCVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int32_t att_index;
  
  if (this->use_single_connectivity_ == false) {
    uVar4 = (long)(this->mesh_->super_PointCloud).attributes_.
                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mesh_->super_PointCloud).attributes_.
                  super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
    ::resize(&this->attribute_data_,(long)(uVar4 * 0x20000000 + -0x100000000) >> 0x20);
    uVar6 = (uint)(uVar4 >> 3);
    if (1 < (int)uVar6) {
      uVar4 = 0;
      iVar5 = 0;
      do {
        att._M_t.
        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
        .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
             (this->mesh_->super_PointCloud).attributes_.
             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
             super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
             ._M_t;
        if (*(Type *)((long)att._M_t.
                            super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                            .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                     0x38) != POSITION) {
          pAVar1 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar1[iVar5].attribute_index = (int)uVar4;
          pIVar2 = *(pointer *)
                    &pAVar1[iVar5].encoding_data.encoded_attribute_value_index_to_corner_map.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ;
          if (*(pointer *)
               ((long)&pAVar1[iVar5].encoding_data.encoded_attribute_value_index_to_corner_map.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               + 8) != pIVar2) {
            *(pointer *)
             ((long)&pAVar1[iVar5].encoding_data.encoded_attribute_value_index_to_corner_map.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             + 8) = pIVar2;
          }
          pCVar3 = (this->corner_table_)._M_t.
                   super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                   .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::reserve(&pAVar1[iVar5].encoding_data.encoded_attribute_value_index_to_corner_map,
                    (long)(int)((ulong)((long)*(pointer *)
                                               ((long)&(pCVar3->corner_to_vertex_map_).vector_ + 8)
                                       - *(long *)&(pCVar3->corner_to_vertex_map_).vector_) >> 2));
          pAVar1 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar1[iVar5].encoding_data.num_values = 0;
          MeshAttributeCornerTable::InitFromAttribute
                    (&pAVar1[iVar5].connectivity_data,this->mesh_,
                     (this->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                     (PointAttribute *)
                     att._M_t.
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
          iVar5 = iVar5 + 1;
        }
        uVar4 = uVar4 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar4);
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::InitAttributeData() {
  if (use_single_connectivity_) {
    return true;  // All attributes use the same connectivity.
  }

  const int num_attributes = mesh_->num_attributes();
  // Ignore the position attribute. It's decoded separately.
  attribute_data_.resize(num_attributes - 1);
  if (num_attributes == 1) {
    return true;
  }
  int data_index = 0;
  for (int i = 0; i < num_attributes; ++i) {
    const int32_t att_index = i;
    if (mesh_->attribute(att_index)->attribute_type() ==
        GeometryAttribute::POSITION) {
      continue;
    }
    const PointAttribute *const att = mesh_->attribute(att_index);
    attribute_data_[data_index].attribute_index = att_index;
    attribute_data_[data_index]
        .encoding_data.encoded_attribute_value_index_to_corner_map.clear();
    attribute_data_[data_index]
        .encoding_data.encoded_attribute_value_index_to_corner_map.reserve(
            corner_table_->num_corners());
    attribute_data_[data_index].encoding_data.num_values = 0;
    attribute_data_[data_index].connectivity_data.InitFromAttribute(
        mesh_, corner_table_.get(), att);
    ++data_index;
  }
  return true;
}